

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

NeuralNetworkImageScaler * __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::mutable_scaler(NeuralNetworkPreprocessing *this)

{
  NeuralNetworkImageScaler *this_00;
  
  if (this->_oneof_case_[0] == 10) {
    this_00 = (this->preprocessor_).scaler_;
  }
  else {
    clear_preprocessor(this);
    this->_oneof_case_[0] = 10;
    this_00 = (NeuralNetworkImageScaler *)operator_new(0x28);
    NeuralNetworkImageScaler::NeuralNetworkImageScaler(this_00);
    (this->preprocessor_).scaler_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::NeuralNetworkImageScaler* NeuralNetworkPreprocessing::mutable_scaler() {
  if (!has_scaler()) {
    clear_preprocessor();
    set_has_scaler();
    preprocessor_.scaler_ = new ::CoreML::Specification::NeuralNetworkImageScaler;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkPreprocessing.scaler)
  return preprocessor_.scaler_;
}